

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError ScanDeviceInfos(PaUtilHostApiRepresentation *hostApi,PaHostApiIndex hostApiIndex,
                       void **scanResults,int *newDeviceCount)

{
  PaError result;
  PaAlsaHostApiRepresentation *alsaHostApi;
  int *newDeviceCount_local;
  void **scanResults_local;
  PaHostApiIndex hostApiIndex_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  paUtilErr_ = BuildDeviceList((PaAlsaHostApiRepresentation *)hostApi,scanResults,newDeviceCount);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'BuildDeviceList( alsaHostApi, scanResults, newDeviceCount )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4770\n"
                     );
    hostApi_local._4_4_ = paUtilErr_;
  }
  else {
    hostApi_local._4_4_ = 0;
  }
  return hostApi_local._4_4_;
}

Assistant:

static PaError ScanDeviceInfos(struct PaUtilHostApiRepresentation *hostApi, PaHostApiIndex hostApiIndex,
                               void **scanResults, int *newDeviceCount)
{
    PaAlsaHostApiRepresentation* alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;
    PaError result = paNoError;
    PA_ENSURE(BuildDeviceList( alsaHostApi, scanResults, newDeviceCount ));

    return paNoError;

    error:
    return result;
}